

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddUtil.c
# Opt level: O0

double Cudd_CountMinterm(DdManager *manager,DdNode *node,int nvars)

{
  DdHashTable *table_00;
  double max_00;
  double ep;
  double epsilon;
  double res;
  DdHashTable *table;
  double max;
  int nvars_local;
  DdNode *node_local;
  DdManager *manager_local;
  
  background = manager->background;
  zero = (DdNode *)((ulong)manager->one ^ 1);
  max_00 = pow(2.0,(double)nvars);
  table_00 = cuddHashTableInit(manager,1,2);
  if (table_00 == (DdHashTable *)0x0) {
    manager_local = (DdManager *)0xbff0000000000000;
  }
  else {
    ep = Cudd_ReadEpsilon(manager);
    Cudd_SetEpsilon(manager,0.0);
    manager_local = (DdManager *)ddCountMintermAux(node,max_00,table_00);
    cuddHashTableQuit(table_00);
    Cudd_SetEpsilon(manager,ep);
  }
  return (double)manager_local;
}

Assistant:

double
Cudd_CountMinterm(
  DdManager * manager,
  DdNode * node,
  int  nvars)
{
    double      max;
    DdHashTable *table;
    double      res;
    CUDD_VALUE_TYPE epsilon;

    background = manager->background;
    zero = Cudd_Not(manager->one);

    max = pow(2.0,(double)nvars);
    table = cuddHashTableInit(manager,1,2);
    if (table == NULL) {
        return((double)CUDD_OUT_OF_MEM);
    }
    epsilon = Cudd_ReadEpsilon(manager);
    Cudd_SetEpsilon(manager,(CUDD_VALUE_TYPE)0.0);
    res = ddCountMintermAux(node,max,table);
    cuddHashTableQuit(table);
    Cudd_SetEpsilon(manager,epsilon);

    return(res);

}